

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O1

void __thiscall helics::zeromq::ZmqCommsSS::queue_tx_function(ZmqCommsSS *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  socket_base sVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  value_type *__val;
  _Base_ptr p_Var10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  int *piVar12;
  error_t *peVar13;
  _Base_ptr p_Var14;
  _Rb_tree_header *p_Var15;
  ActionMessage *command;
  bool bVar16;
  socket_t *psVar18;
  undefined8 uVar19;
  ulong uVar20;
  context_t *context_;
  vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_> *sockets_00;
  timespec *ptVar21;
  _Alloc_hider _Var22;
  size_type sVar23;
  char cVar24;
  uint uVar25;
  bool bVar26;
  string_view message;
  string_view message_00;
  string empty_1;
  vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> poller;
  socket_t brokerConnection;
  socket_t brokerSocket;
  vector<char,_std::allocator<char>_> buffer;
  vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_> sockets;
  shared_ptr<ZmqContextManager> ctx;
  string empty;
  map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  routes;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  connection_info;
  optional<std::pair<helics::route_id,_helics::ActionMessage>_> tx_msg;
  message_t msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> local_3c8;
  socket_t local_3a8;
  socket_t local_398;
  vector<char,_std::allocator<char>_> local_388;
  vector<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_> local_368;
  string local_350;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *local_330;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308 [11];
  bool local_258;
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_250;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_220;
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0 [11];
  bool local_130;
  ActionMessage local_128;
  message_t local_70;
  bool bVar17;
  
  local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f0._8_8_ = 0;
  local_1e0[0]._M_local_buf[0] = '\0';
  local_1f0._0_8_ = local_1e0;
  ZmqContextManager::getContextPointer((ZmqContextManager *)local_328,(string *)local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._0_8_ != local_1e0) {
    operator_delete((void *)local_1f0._0_8_,
                    CONCAT71(local_1e0[0]._M_allocated_capacity._1_7_,local_1e0[0]._M_local_buf[0])
                    + 1);
  }
  zmq_msg_init(&local_70);
  if ((this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress._M_string_length
      != 0) {
    LOCK();
    (this->super_NetworkCommsInterface).hasBroker._M_base._M_i = true;
    UNLOCK();
  }
  local_250._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_250._M_impl.super__Rb_tree_header._M_header;
  local_250._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_250._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_250._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_220._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_220._M_impl.super__Rb_tree_header._M_header;
  local_220._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_220._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_220._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_250._M_impl.super__Rb_tree_header._M_header._M_right =
       local_250._M_impl.super__Rb_tree_header._M_header._M_left;
  local_220._M_impl.super__Rb_tree_header._M_header._M_right =
       local_220._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->super_NetworkCommsInterface).brokerPort < 0) {
    iVar7 = getDefaultPort(10);
    (this->super_NetworkCommsInterface).brokerPort = iVar7;
  }
  if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 0) {
    iVar7 = getDefaultPort(10);
    LOCK();
    (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i = iVar7;
    UNLOCK();
  }
  zmq::socket_t::socket_t(&local_398,*(context_t **)(local_328._0_8_ + 0x20),6);
  zmq::socket_t::socket_t(&local_3a8,*(context_t **)(local_328._0_8_ + 0x20),5);
  psVar18 = &local_398;
  iVar7 = initializeBrokerConnections(this,psVar18,&local_3a8);
  iVar8 = (int)psVar18;
  if (iVar7 < 0) {
    iVar7 = 4;
    CommsInterface::setTxStatus((CommsInterface *)this,ERRORED);
    zmq::socket_t::close(&local_398,iVar7);
    zmq::socket_t::close(&local_3a8,iVar7);
  }
  else {
    if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == false) {
      zmq::socket_t::close(&local_398,iVar8);
    }
    if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
      zmq::socket_t::close(&local_3a8,iVar8);
      CommsInterface::setTxStatus((CommsInterface *)this,CONNECTED);
    }
    local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
    local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
         super__Vector_impl_data._M_start + 2;
    (local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
     super__Vector_impl_data._M_start)->socket = (void *)0x0;
    (local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
     super__Vector_impl_data._M_start)->fd = 0;
    (local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
     super__Vector_impl_data._M_start)->events = 0;
    (local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
     super__Vector_impl_data._M_start)->revents = 0;
    local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
    super__Vector_impl_data._M_start[1].socket = (void *)0x0;
    local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
    super__Vector_impl_data._M_start[1].fd = 0;
    local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
    super__Vector_impl_data._M_start[1].events = 0;
    local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
    super__Vector_impl_data._M_start[1].revents = 0;
    local_368.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_368.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_368.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
    local_368.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_368.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>._M_impl.
         super__Vector_impl_data._M_start + 2;
    *local_368.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>._M_impl.
     super__Vector_impl_data._M_start = (socket_t *)0x0;
    local_368.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>._M_impl.
    super__Vector_impl_data._M_start[1] = (socket_t *)0x0;
    bVar16 = (this->super_NetworkCommsInterface).super_CommsInterface.serverMode;
    sVar23 = (size_type)bVar16;
    local_368.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_368.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    loadPoller(&local_3c8,&local_368,&local_398,&local_3a8,bVar16,
               (bool)((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1));
    iVar7 = 0;
    CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
    local_330 = &(this->super_NetworkCommsInterface).super_CommsInterface.txQueue;
    bVar17 = false;
    bVar16 = false;
    do {
      local_128.messageAction = cmd_ignore;
      local_128.messageID = 0;
      local_128.source_id.gid = 0;
      local_128.source_handle.hid = -1700000000;
      local_128.dest_id.gid = 0;
      local_128.dest_handle.hid = -1700000000;
      local_128.payload.buffer._M_elems[0x38] = 0;
      local_128.payload.buffer._M_elems[0x39] = 0;
      local_128.payload.buffer._M_elems[0x3a] = 0;
      local_128.payload.buffer._M_elems[0x3b] = 0;
      local_128.payload.buffer._M_elems[0x3c] = 0;
      local_128.payload.buffer._M_elems[0x3d] = 0;
      local_128.payload.buffer._M_elems[0x3e] = 0;
      local_128.payload.buffer._M_elems[0x3f] = 0;
      local_128.payload.bufferSize = 0;
      local_128.payload.buffer._M_elems[0x28] = 0;
      local_128.payload.buffer._M_elems[0x29] = 0;
      local_128.payload.buffer._M_elems[0x2a] = 0;
      local_128.payload.buffer._M_elems[0x2b] = 0;
      local_128.payload.buffer._M_elems[0x2c] = 0;
      local_128.payload.buffer._M_elems[0x2d] = 0;
      local_128.payload.buffer._M_elems[0x2e] = 0;
      local_128.payload.buffer._M_elems[0x2f] = 0;
      local_128.payload.buffer._M_elems[0x30] = 0;
      local_128.payload.buffer._M_elems[0x31] = 0;
      local_128.payload.buffer._M_elems[0x32] = 0;
      local_128.payload.buffer._M_elems[0x33] = 0;
      local_128.payload.buffer._M_elems[0x34] = 0;
      local_128.payload.buffer._M_elems[0x35] = 0;
      local_128.payload.buffer._M_elems[0x36] = 0;
      local_128.payload.buffer._M_elems[0x37] = 0;
      local_128.payload.buffer._M_elems[0x18] = 0;
      local_128.payload.buffer._M_elems[0x19] = 0;
      local_128.payload.buffer._M_elems[0x1a] = 0;
      local_128.payload.buffer._M_elems[0x1b] = 0;
      local_128.payload.buffer._M_elems[0x1c] = 0;
      local_128.payload.buffer._M_elems[0x1d] = 0;
      local_128.payload.buffer._M_elems[0x1e] = 0;
      local_128.payload.buffer._M_elems[0x1f] = 0;
      local_128.payload.buffer._M_elems[0x20] = 0;
      local_128.payload.buffer._M_elems[0x21] = 0;
      local_128.payload.buffer._M_elems[0x22] = 0;
      local_128.payload.buffer._M_elems[0x23] = 0;
      local_128.payload.buffer._M_elems[0x24] = 0;
      local_128.payload.buffer._M_elems[0x25] = 0;
      local_128.payload.buffer._M_elems[0x26] = 0;
      local_128.payload.buffer._M_elems[0x27] = 0;
      local_128.payload.buffer._M_elems[8] = 0;
      local_128.payload.buffer._M_elems[9] = 0;
      local_128.payload.buffer._M_elems[10] = 0;
      local_128.payload.buffer._M_elems[0xb] = 0;
      local_128.payload.buffer._M_elems[0xc] = 0;
      local_128.payload.buffer._M_elems[0xd] = 0;
      local_128.payload.buffer._M_elems[0xe] = 0;
      local_128.payload.buffer._M_elems[0xf] = 0;
      local_128.payload.buffer._M_elems[0x10] = 0;
      local_128.payload.buffer._M_elems[0x11] = 0;
      local_128.payload.buffer._M_elems[0x12] = 0;
      local_128.payload.buffer._M_elems[0x13] = 0;
      local_128.payload.buffer._M_elems[0x14] = 0;
      local_128.payload.buffer._M_elems[0x15] = 0;
      local_128.payload.buffer._M_elems[0x16] = 0;
      local_128.payload.buffer._M_elems[0x17] = 0;
      local_128.Tso.internalTimeCode = 0;
      local_128.payload.buffer._M_elems[0] = 0;
      local_128.payload.buffer._M_elems[1] = 0;
      local_128.payload.buffer._M_elems[2] = 0;
      local_128.payload.buffer._M_elems[3] = 0;
      local_128.payload.buffer._M_elems[4] = 0;
      local_128.payload.buffer._M_elems[5] = 0;
      local_128.payload.buffer._M_elems[6] = 0;
      local_128.payload.buffer._M_elems[7] = 0;
      local_128.Te.internalTimeCode = 0;
      local_128.Tdemin.internalTimeCode = 0;
      local_128.counter = 0;
      local_128.flags = 0;
      local_128.sequenceID = 0;
      local_128.actionTime.internalTimeCode = 0;
      local_128.payload.bufferCapacity = 0x40;
      local_128.payload.heap = (byte *)&local_128.payload;
      local_128.stringData.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.stringData.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128.payload.nonOwning = false;
      local_128.payload.locked = false;
      local_128.payload.usingAllocatedBuffer = false;
      local_128.payload.errorCondition = '\0';
      local_128.payload.userKey = 0;
      local_128.stringData.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
      ::try_pop((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)local_1f0,local_330
               );
      iVar8 = zmq_poll(local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (ulong)((long)local_3c8.
                                     super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_3c8.
                                    super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4,0);
      if (iVar8 < 0) {
        peVar13 = (error_t *)__cxa_allocate_exception(0x10);
        zmq::error_t::error_t(peVar13);
        __cxa_throw(peVar13,&zmq::error_t::typeinfo,std::exception::~exception);
      }
      if ((iVar8 == 0) || (local_130 == false)) {
        sched_yield();
      }
      iVar8 = 0;
      do {
        if ((local_130 != true) || (0x13 < iVar8)) break;
        ActionMessage::operator=(&local_128,(ActionMessage *)(local_1f0 + 8));
        uVar5 = local_1f0._0_4_;
        if (((local_128.messageAction == cmd_protocol_priority) ||
            ((local_128.messageAction == cmd_protocol_big ||
             (local_128.messageAction == cmd_protocol)))) && (local_1f0._0_4_ == -1)) {
          bVar6 = processTxControlCmd(this,&local_128,
                                      (map<helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&local_250,
                                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&local_220);
          bVar26 = true;
          if (!bVar6) goto LAB_002c8e51;
          cVar24 = bVar6 * '\x05';
LAB_002c8f62:
          bVar17 = true;
          bVar16 = true;
        }
        else {
          bVar26 = false;
LAB_002c8e51:
          if (!bVar26) {
            if (local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            ActionMessage::to_vector(&local_128,&local_388);
            if (uVar5 == -1) {
              iVar7 = processIncomingMessage
                                (this,&local_70,
                                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_220);
              if (iVar7 < 0) {
                cVar24 = '\x05';
                iVar7 = -1;
                goto LAB_002c8f62;
              }
            }
            else if (uVar5 == 0) {
              if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
                message._M_str = "no route to broker for message";
                message._M_len = 0x1e;
                CommsInterface::logWarning((CommsInterface *)this,message);
              }
              else {
                local_318._8_8_ = 0;
                local_308[0]._M_allocated_capacity =
                     local_308[0]._M_allocated_capacity & 0xffffffffffffff00;
                local_318._0_8_ = local_308;
                zmq::detail::socket_base::send
                          (&local_3a8.super_socket_base,
                           (int)local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                           local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish +
                           -(long)local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start,1,(int)sVar23);
                uVar19 = local_308[0]._M_allocated_capacity;
                _Var22._M_p = (pointer)local_318._0_8_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._0_8_ != local_308) {
LAB_002c90a9:
                  operator_delete(_Var22._M_p,(ulong)((long)&((context_t *)uVar19)->ptr + 1));
                }
              }
            }
            else {
              p_Var10 = &local_250._M_impl.super__Rb_tree_header._M_header;
              for (p_Var14 = local_250._M_impl.super__Rb_tree_header._M_header._M_parent;
                  (_Rb_tree_header *)p_Var14 != (_Rb_tree_header *)0x0;
                  p_Var14 = (&p_Var14->_M_left)[(int)*(size_t *)(p_Var14 + 1) < (int)uVar5]) {
                if ((int)uVar5 <= (int)*(size_t *)(p_Var14 + 1)) {
                  p_Var10 = p_Var14;
                }
              }
              p_Var2 = &local_250._M_impl.super__Rb_tree_header;
              p_Var15 = p_Var2;
              if (((_Rb_tree_header *)p_Var10 != p_Var2) &&
                 (p_Var15 = (_Rb_tree_header *)p_Var10,
                 (int)uVar5 < (int)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
                p_Var15 = p_Var2;
              }
              if (p_Var15 == p_Var2) {
                if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) == 0) {
                  bVar26 = isIgnoreableCommand(&local_128);
                  if (!bVar26) {
                    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3e8,"unknown route and no broker, dropping message "
                               ,"");
                    prettyPrintString_abi_cxx11_(&local_350,(helics *)&local_128,command);
                    uVar20 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                      uVar20 = CONCAT71(local_3e8.field_2._M_allocated_capacity._1_7_,
                                        local_3e8.field_2._M_local_buf[0]);
                    }
                    sVar23 = local_3e8._M_string_length;
                    if (uVar20 < local_350._M_string_length + local_3e8._M_string_length) {
                      uVar19 = 0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_350._M_dataplus._M_p != &local_350.field_2) {
                        uVar19 = local_350.field_2._M_allocated_capacity;
                      }
                      if ((ulong)uVar19 < local_350._M_string_length + local_3e8._M_string_length)
                      goto LAB_002c9193;
                      pbVar11 = CLI::std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&local_350,0,0,local_3e8._M_dataplus._M_p,
                                        local_3e8._M_string_length);
                    }
                    else {
LAB_002c9193:
                      pbVar11 = CLI::std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                                _M_append(&local_3e8,local_350._M_dataplus._M_p,
                                          local_350._M_string_length);
                    }
                    local_318._0_8_ = local_308;
                    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(pbVar11->_M_dataplus)._M_p;
                    paVar1 = &pbVar11->field_2;
                    if (paVar3 == paVar1) {
                      local_308[0]._0_8_ = paVar1->_M_allocated_capacity;
                      local_308[0]._8_8_ = *(undefined8 *)((long)&pbVar11->field_2 + 8);
                    }
                    else {
                      local_308[0]._0_8_ = paVar1->_M_allocated_capacity;
                      local_318._0_8_ = paVar3;
                    }
                    local_318._8_8_ = pbVar11->_M_string_length;
                    (pbVar11->_M_dataplus)._M_p = (pointer)paVar1;
                    pbVar11->_M_string_length = 0;
                    paVar1->_M_local_buf[0] = '\0';
                    message_00._M_str = (char *)local_318._0_8_;
                    message_00._M_len = local_318._8_8_;
                    CommsInterface::logWarning((CommsInterface *)this,message_00);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_318._0_8_ != local_308) {
                      operator_delete((void *)local_318._0_8_,
                                      (ulong)(local_308[0]._M_allocated_capacity + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_350._M_dataplus._M_p != &local_350.field_2) {
                      operator_delete(local_350._M_dataplus._M_p,
                                      local_350.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                      uVar19 = (context_t *)
                               CONCAT71(local_3e8.field_2._M_allocated_capacity._1_7_,
                                        local_3e8.field_2._M_local_buf[0]);
                      _Var22._M_p = local_3e8._M_dataplus._M_p;
                      goto LAB_002c90a9;
                    }
                  }
                }
                else {
                  zmq::detail::socket_base::send
                            (&local_3a8.super_socket_base,
                             (int)local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                             local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish +
                             -(long)local_388.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start,1,(int)sVar23);
                }
              }
              else {
                local_318._0_8_ = local_308;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_318,*(long *)(p_Var15 + 1),
                           *(long *)(p_Var15 + 1) + *(long *)((long)(p_Var15 + 1) + 8));
                local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
                local_3e8._M_string_length = 0;
                local_3e8.field_2._M_local_buf[0] = '\0';
                iVar9 = zmq_send(local_398.super_socket_base._handle,local_318._0_8_,local_318._8_8_
                                 ,2);
                if ((iVar9 < 0) && (iVar9 = zmq_errno(), iVar9 != 0xb)) {
                  peVar13 = (error_t *)__cxa_allocate_exception(0x10);
                  zmq::error_t::error_t(peVar13);
LAB_002c9652:
                  __cxa_throw(peVar13,&zmq::error_t::typeinfo,std::exception::~exception);
                }
                iVar9 = zmq_send(local_398.super_socket_base._handle,local_3e8._M_dataplus._M_p,
                                 local_3e8._M_string_length,2);
                if ((iVar9 < 0) && (iVar9 = zmq_errno(), iVar9 != 0xb)) {
                  peVar13 = (error_t *)__cxa_allocate_exception(0x10);
                  zmq::error_t::error_t(peVar13);
                  goto LAB_002c9652;
                }
                zmq::detail::socket_base::send
                          (&local_398.super_socket_base,
                           (int)local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                           local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish +
                           -(long)local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start,1,(int)sVar23);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
                  operator_delete(local_3e8._M_dataplus._M_p,
                                  CONCAT71(local_3e8.field_2._M_allocated_capacity._1_7_,
                                           local_3e8.field_2._M_local_buf[0]) + 1);
                }
                uVar19 = local_308[0]._M_allocated_capacity;
                _Var22._M_p = (pointer)local_318._0_8_;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._0_8_ != local_308) goto LAB_002c90a9;
              }
            }
          }
          iVar9 = iVar8 + 1;
          bVar26 = iVar8 < 0x13;
          iVar8 = iVar9;
          cVar24 = '\0';
          if (bVar26) {
            gmlc::containers::
            BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
            ::try_pop((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)local_318,
                      local_330);
            std::_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>::
            _M_move_assign((_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                            *)local_1f0,
                           (_Optional_payload_base<std::pair<helics::route_id,_helics::ActionMessage>_>
                            *)local_318);
            cVar24 = '\0';
            if (local_258 == true) {
              local_258 = false;
              ActionMessage::~ActionMessage((ActionMessage *)(local_318 + 8));
            }
          }
        }
      } while (cVar24 == '\0');
      uVar25 = 0;
      do {
        uVar20 = (ulong)((long)local_3c8.
                               super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_3c8.
                              super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 4;
        iVar8 = zmq_poll(local_3c8.
                         super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl
                         .super__Vector_impl_data._M_start,uVar20,0);
        iVar9 = (int)uVar20;
        if (iVar8 < 0) {
          peVar13 = (error_t *)__cxa_allocate_exception(0x10);
          zmq::error_t::error_t(peVar13);
          __cxa_throw(peVar13,&zmq::error_t::typeinfo,std::exception::~exception);
        }
        if (iVar8 != 0) {
          if (((local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>.
                _M_impl.super__Vector_impl_data._M_start)->revents & 1) != 0) {
            psVar18 = *local_368.
                       super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            iVar7 = processRxMessage(this,psVar18,
                                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&local_220);
            iVar9 = (int)psVar18;
          }
          if ((((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) &&
              (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0)) &&
             ((local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl
               .super__Vector_impl_data._M_start[1].revents & 1) != 0)) {
            psVar18 = local_368.
                      super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>._M_impl.
                      super__Vector_impl_data._M_start[1];
            iVar7 = processRxMessage(this,psVar18,
                                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&local_220);
            iVar9 = (int)psVar18;
          }
          bVar16 = bVar17;
          if (iVar7 < 0) {
            bVar16 = true;
          }
          bVar17 = bVar16;
          if (iVar7 == 5) {
            zmq::socket_t::close(&local_3a8,iVar9);
            context_ = *(context_t **)(local_328._0_8_ + 0x20);
            zmq::socket_t::socket_t((socket_t *)local_318,context_,5);
            sVar4._handle = local_3a8.super_socket_base._handle;
            local_3a8.super_socket_base._handle = (void *)local_318._0_8_;
            local_318._0_8_ = sVar4._handle;
            zmq::socket_t::close((socket_t *)local_318,(int)context_);
            initializeConnectionToBroker(this,&local_3a8);
            bVar26 = (this->super_NetworkCommsInterface).super_CommsInterface.serverMode;
            sVar23 = (size_type)bVar26;
            iVar7 = 5;
            sockets_00 = &local_368;
            loadPoller(&local_3c8,sockets_00,&local_398,&local_3a8,bVar26,
                       (bool)((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1));
            iVar9 = (int)sockets_00;
          }
        }
      } while ((iVar8 != 0) && (bVar26 = uVar25 < 4, uVar25 = uVar25 + 1, bVar26));
      if (local_130 == true) {
        local_130 = false;
        ActionMessage::~ActionMessage((ActionMessage *)(local_1f0 + 8));
      }
      ActionMessage::~ActionMessage(&local_128);
    } while (!bVar16);
    std::
    _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&local_250);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_220);
    if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
      local_1f0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_1f0._8_8_ = 50000000;
      do {
        ptVar21 = (timespec *)local_1f0;
        iVar7 = nanosleep((timespec *)local_1f0,(timespec *)local_1f0);
        iVar9 = (int)ptVar21;
        if (iVar7 != -1) break;
        piVar12 = __errno_location();
      } while (*piVar12 == 4);
      zmq::socket_t::close(&local_398,iVar9);
    }
    if (((this->super_NetworkCommsInterface).hasBroker._M_base._M_i & 1U) != 0) {
      zmq::socket_t::close(&local_3a8,iVar9);
    }
    iVar7 = 2;
    CommsInterface::setTxStatus((CommsInterface *)this,TERMINATED);
    if ((this->super_NetworkCommsInterface).super_CommsInterface.rxStatus._M_i == CONNECTED) {
      iVar7 = 2;
      CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
    }
    if (local_368.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      uVar20 = (long)local_368.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)local_368.super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      operator_delete(local_368.
                      super__Vector_base<zmq::socket_t_*,_std::allocator<zmq::socket_t_*>_>._M_impl.
                      super__Vector_impl_data._M_start,uVar20);
      iVar7 = (int)uVar20;
    }
    if (local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      uVar20 = (long)local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      operator_delete(local_3c8.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>.
                      _M_impl.super__Vector_impl_data._M_start,uVar20);
      iVar7 = (int)uVar20;
    }
  }
  zmq::socket_t::close(&local_3a8,iVar7);
  zmq::socket_t::close(&local_398,iVar7);
  CLI::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_220);
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_250);
  zmq_msg_close(&local_70);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._8_8_);
  }
  if (local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_388.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ZmqCommsSS::queue_tx_function()
{
    std::vector<char> buffer;
    auto ctx = ZmqContextManager::getContextPointer();
    zmq::message_t msg;

    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }

    // contains mapping between route id and core name
    std::map<route_id, std::string> routes;
    // contains mapping between core name and address
    std::map<std::string, std::string> connection_info;

    if (brokerPort < 0) {
        brokerPort = getDefaultBrokerPort();
    }
    if (PortNumber < 0) {
        PortNumber = getDefaultBrokerPort();
    }
    zmq::socket_t brokerSocket(ctx->getBaseContext(), ZMQ_ROUTER);
    zmq::socket_t brokerConnection(ctx->getBaseContext(), ZMQ_DEALER);
    auto res = initializeBrokerConnections(brokerSocket, brokerConnection);
    if (res < 0) {
        setTxStatus(ConnectionStatus::ERRORED);
        brokerSocket.close();
        brokerConnection.close();
        return;
    }
    // Root broker is set
    if (!serverMode) {
        brokerSocket.close();
    }
    if (!hasBroker) {
        brokerConnection.close();
        setTxStatus(ConnectionStatus::CONNECTED);
    }
    // setTxStatus(ConnectionStatus::CONNECTED);

    std::vector<zmq::pollitem_t> poller(2);
    std::vector<zmq::socket_t*> sockets(2);
    loadPoller(poller, sockets, brokerSocket, brokerConnection, serverMode, hasBroker);

    setRxStatus(ConnectionStatus::CONNECTED);

    int status{0};

    bool haltLoop{false};
    //  std::vector<ActionMessage> txlist;
    while (!haltLoop) {
        route_id rid;
        ActionMessage cmd;
        int count{0};

        // Handle Tx messages first
        auto tx_msg = txQueue.try_pop();
        int rc = zmq::poll(poller, 0L);
        if (!tx_msg || (rc <= 0)) {
            std::this_thread::yield();
        }
        int tx_count{0};
        // Balance between tx and rx processing since both running on single thread
        while (tx_msg && (tx_count < TX_RX_MSG_COUNT)) {
            bool processed{false};
            cmd = std::move(tx_msg->second);
            rid = tx_msg->first;
            if (isProtocolCommand(cmd)) {
                if (rid == control_route) {
                    processed = true;
                    auto close_tx = processTxControlCmd(cmd, routes, connection_info);

                    if (close_tx) {
                        haltLoop = true;
                        break;
                    }
                }
            }
            if (!processed) {
                buffer.clear();
                cmd.to_vector(buffer);
                if (rid == parent_route_id) {
                    if (hasBroker) {
                        std::string empty;
                        brokerConnection.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                              zmq::send_flags::dontwait);
                    } else {
                        logWarning("no route to broker for message");
                    }
                } else if (rid == control_route) {
                    status = processIncomingMessage(msg, connection_info);  //----------> ToCheck
                    if (status < 0) {
                        haltLoop = true;
                        break;
                    }
                } else {
                    // If route found send out through the front end socket connection
                    auto rt_find = routes.find(rid);
                    if (rt_find != routes.end()) {
                        std::string route_name = rt_find->second;
                        std::string empty;
                        // Need to first send identity and empty string
                        brokerSocket.send(route_name, zmq::send_flags::sndmore);
                        brokerSocket.send(empty, zmq::send_flags::sndmore);
                        // Send the actual data
                        brokerSocket.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                          zmq::send_flags::dontwait);
                    } else {
                        if (hasBroker) {
                            brokerConnection.send(zmq::const_buffer(buffer.data(), buffer.size()),
                                                  zmq::send_flags::dontwait);
                        } else {
                            if (!isIgnoreableCommand(cmd)) {
                                logWarning(
                                    std::string("unknown route and no broker, dropping message ") +
                                    prettyPrintString(cmd));
                            }
                        }
                    }
                }
            }
            tx_count++;
            if (tx_count < TX_RX_MSG_COUNT) {
                tx_msg = txQueue.try_pop();
            }
        }

        count = 0;
        rc = 1;
        while ((rc > 0) && (count < 5)) {
            rc = zmq::poll(poller, 0L);

            if (rc > 0) {
                if (zmq::has_message(poller[0])) {
                    status = processRxMessage(*sockets[0], connection_info);
                }
                if (serverMode && hasBroker) {
                    if (zmq::has_message(poller[1])) {
                        status = processRxMessage(*sockets[1], connection_info);
                    }
                }

                if (status < 0) {
                    haltLoop = true;
                }
                if (status == 5) {
                    brokerConnection.close();
                    brokerConnection = zmq::socket_t(ctx->getBaseContext(), ZMQ_DEALER);
                    initializeConnectionToBroker(brokerConnection);
                    loadPoller(
                        poller, sockets, brokerSocket, brokerConnection, serverMode, hasBroker);
                }
            }
            count++;
        }
    }
    routes.clear();
    connection_info.clear();
    if (serverMode) {
        std::this_thread::sleep_for(std::chrono::milliseconds(50));
        brokerSocket.close();
    }
    if (hasBroker) {
        brokerConnection.close();
    }
    setTxStatus(ConnectionStatus::TERMINATED);
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        setRxStatus(ConnectionStatus::TERMINATED);
    }
}